

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O3

void __thiscall fpsstate::spawnstate(fpsstate *this,int gamemode)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  if (gamemode == -1) {
    this->gunselect = 0;
    return;
  }
  uVar1 = gamemode + 3;
  if (uVar1 < 0x1a) {
    if ((0x2f57f3fUL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      this->armour = 0;
      this->health = 1;
      this->gunselect = 4;
      this->ammo[4] = 100;
      return;
    }
    if (gamemode == 10) {
      if (regenbluearmour != 0) {
        this->armour = 0x19;
        this->armourtype = 0;
      }
      this->gunselect = 6;
    }
    else {
      uVar6 = (ulong)uVar1;
      if (0xfffffffffffffffc < uVar6 - 0xd) {
        this->armour = 100;
        this->armourtype = 1;
        this->ammo[6] = 0x28;
        uVar2 = randomMT();
        uVar7 = (uVar2 & 0xffffff) % 5;
        uVar1 = (uVar2 & 0xffffff) % 5 + 1;
        this->gunselect = uVar1;
        bVar8 = (0x85503fUL >> (uVar6 & 0x3f) & 1) == 0;
        this->ammo[uVar1] = *(int *)((long)&itemstats[0].add + (ulong)(uVar7 << 5)) << bVar8;
        do {
          uVar2 = randomMT();
          uVar1 = (uVar2 & 0xffffff) % 5;
        } while (uVar7 == uVar1);
        this->ammo[(ulong)uVar1 + 1] = itemstats[uVar1].add << bVar8;
        if (!bVar8) {
          return;
        }
        this->ammo[5] = this->ammo[5] + 1;
        return;
      }
      if ((0x18ffcffUL >> (uVar6 & 0x3f) & 1) == 0) {
        this->armour = 100;
        this->armourtype = 1;
        piVar3 = this->ammo;
        lVar5 = 0;
        do {
          piVar3 = piVar3 + 1;
          *piVar3 = *(int *)((long)&itemstats[0].add + lVar5) * 2;
          lVar5 = lVar5 + 0x20;
        } while (lVar5 != 0xa0);
        this->gunselect = 2;
        this->ammo[2] = this->ammo[2] / 2;
        return;
      }
      if ((uVar1 < 0x17) && ((long)gamemode - 0x14U < 0xfffffffffffffff7)) {
        if (uVar1 < 2) {
          if (uVar1 == 1) {
            this->armour = 0x19;
            this->armourtype = 0;
          }
          uVar4 = 0x5000000001;
          goto LAB_0014677e;
        }
        goto LAB_0014676c;
      }
      this->armour = 0x32;
      this->armourtype = 0;
    }
  }
  else {
LAB_0014676c:
    this->armour = 0x19;
    this->armourtype = 0;
  }
  uVar4 = 0x2800000001;
LAB_0014677e:
  *(undefined8 *)(this->ammo + 5) = uVar4;
  return;
}

Assistant:

void spawnstate(int gamemode)
    {
        if(m_demo)
        {
            gunselect = GUN_FIST;
        }
        else if(m_insta)
        {
            armour = 0;
            health = 1;
            gunselect = GUN_RIFLE;
            ammo[GUN_RIFLE] = 100;
        }
        else if(m_regencapture)
        {
            extern int regenbluearmour;
            if(regenbluearmour)
            {
                armourtype = A_BLUE;
                armour = 25;
            }
            gunselect = GUN_PISTOL;
            ammo[GUN_PISTOL] = 40;
            ammo[GUN_GL] = 1;
        }
        else if(m_tactics)
        {
            armourtype = A_GREEN;
            armour = 100;
            ammo[GUN_PISTOL] = 40;
            int spawngun1 = rnd(5)+1, spawngun2;
            gunselect = spawngun1;
            baseammo(spawngun1, m_noitems ? 2 : 1);
            do spawngun2 = rnd(5)+1; while(spawngun1==spawngun2);
            baseammo(spawngun2, m_noitems ? 2 : 1);
            if(m_noitems) ammo[GUN_GL] += 1;
        }
        else if(m_efficiency)
        {
            armourtype = A_GREEN;
            armour = 100;
            loopi(5) baseammo(i+1);
            gunselect = GUN_CG;
            ammo[GUN_CG] /= 2;
        }
        else if(m_ctf || m_collect)
        {
            armourtype = A_BLUE;
            armour = 50;
            ammo[GUN_PISTOL] = 40;
            ammo[GUN_GL] = 1;
        }
        else if(m_sp)
        {
            if(m_dmsp)
            {
                armourtype = A_BLUE;
                armour = 25;
            }
            ammo[GUN_PISTOL] = 80;
            ammo[GUN_GL] = 1;
        }
        else
        {
            armourtype = A_BLUE;
            armour = 25;
            ammo[GUN_PISTOL] = 40;
            ammo[GUN_GL] = 1;
        }
    }